

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replay.c
# Opt level: O2

void replay_commandloop(wchar_t fd)

{
  int iVar1;
  char cVar2;
  wchar_t wVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  wchar_t count;
  hp_time local_3c0;
  hp_time t_start;
  nh_cmd_desc *cmd;
  nh_cmd_arg noarg;
  nh_replay_info rinfo;
  char qbuf [256];
  char buf [256];
  char buf_1 [256];
  
  create_game_windows();
  reset_old_status();
  cVar2 = nh_view_replay_start(fd,&curses_replay_windowprocs,&rinfo);
  if (cVar2 == '\0') {
    return;
  }
  load_keymap();
  draw_msgwin();
  curses_update_status((nh_player_info *)0x0);
  draw_sidebar();
  draw_replay_info(&rinfo);
  curses_display_menu((nh_menuitem_conflict *)&show_replay_help_items,L'\x06',"Replay help:",L'\0',
                      (wchar_t *)0x0);
  do {
    update_old_status();
    wVar3 = get_map_key(L'\x01');
    iVar4 = rinfo.moves;
    if (wVar3 == L' ') {
LAB_001142a8:
      cVar2 = nh_view_replay_step(&rinfo,0,1);
      draw_replay_info(&rinfo);
      if ((cVar2 == '\0') &&
         (wVar3 = curses_msgwin(
                               "You have reached the end of this game. Go back or press ESC to exit."
                               ), wVar3 == L'\x1b')) goto LAB_001145d3;
    }
    else if (wVar3 == L'g') {
      strncpy(qbuf,"What move do you want to jump to?",0x100);
      iVar4 = rinfo.max_moves;
      if (0 < rinfo.max_moves) {
        sVar5 = strlen(qbuf);
        sprintf(qbuf + sVar5," (Max: %d)",(ulong)(uint)iVar4);
      }
      curses_getline(qbuf,buf);
      if ((buf[0] != '\x1b') && (iVar4 = atoi(buf), iVar4 != 0)) {
        nh_view_replay_step(&rinfo,2,iVar4);
      }
    }
    else if (wVar3 == L'Ą') {
      nh_view_replay_step(&rinfo,1,1);
      draw_replay_info(&rinfo);
    }
    else {
      if (wVar3 == L'ą') goto LAB_001142a8;
      if (wVar3 == L'Ĕ') {
        nh_view_replay_step(&rinfo,2,0);
        gettime(&t_start);
        while (rinfo.actions < rinfo.max_actions) {
          nh_view_replay_step(&rinfo,0,1);
          curses_update_status((nh_player_info *)0x0);
          draw_replay_info(&rinfo);
          doupdate();
        }
        draw_msgwin();
        gettime(&local_3c0);
        lVar6 = (local_3c0.tv_sec - t_start.tv_sec) * 1000 +
                (local_3c0.tv_usec - t_start.tv_usec) / 1000;
        snprintf(buf_1,0x100,"%d actions replayed with display in %ld ms. (%ld actions/sec)",
                 (long)rinfo.max_actions,lVar6,((long)rinfo.max_actions * 1000) / lVar6);
        curses_msgwin(buf_1);
        iVar1 = rinfo.moves;
        nh_view_replay_finish();
        nh_view_replay_start(fd,&curses_replay_windowprocs,&rinfo);
        gettime(&t_start);
        nh_view_replay_step(&rinfo,2,iVar1);
        gettime(&local_3c0);
        lVar6 = (local_3c0.tv_sec - t_start.tv_sec) * 1000 +
                (local_3c0.tv_usec - t_start.tv_usec) / 1000;
        snprintf(buf_1,0x100,"%d actions replayed without display in %ld ms. (%ld actions/sec)",
                 (long)rinfo.actions,lVar6,((long)rinfo.actions * 1000) / lVar6);
        curses_msgwin(buf_1);
        iVar1 = rinfo.actions;
        lVar6 = (long)rinfo.actions;
        gettime(&t_start);
        while ((0 < rinfo.actions && (iVar1 < rinfo.actions + 1000))) {
          nh_view_replay_step(&rinfo,1,1);
          curses_update_status((nh_player_info *)0x0);
          draw_msgwin();
          draw_replay_info(&rinfo);
          doupdate();
        }
        gettime(&local_3c0);
        lVar7 = (local_3c0.tv_sec - t_start.tv_sec) * 1000 +
                (local_3c0.tv_usec - t_start.tv_usec) / 1000;
        snprintf(buf_1,0x100,
                 "%d actions replayed backward with display in %ld ms. (%ld actions/sec)",
                 lVar6 - rinfo.actions & 0xffffffff,lVar7,((lVar6 - rinfo.actions) * 1000) / lVar7);
        curses_msgwin(buf_1);
        nh_view_replay_step(&rinfo,2,iVar4);
      }
      else {
        if (wVar3 == L'\x1b') {
LAB_001145d3:
          nh_view_replay_finish();
          free_keymap();
          destroy_game_windows();
          cleanup_messages();
          return;
        }
        count = L'\0';
        noarg.argtype = 2;
        cmd = keymap[wVar3];
        if ((cmd != (nh_cmd_desc *)0x0) &&
           ((-1 < (int)cmd->flags ||
            (handle_internal_cmd(&cmd,&noarg,&count), cmd != (nh_cmd_desc *)0x0)))) {
          nh_command(cmd,count,&noarg);
        }
      }
    }
    draw_msgwin();
    curses_update_status((nh_player_info *)0x0);
    draw_sidebar();
    draw_replay_info(&rinfo);
  } while( true );
}

Assistant:

void replay_commandloop(int fd)
{
    int key, move, count;
    char buf[BUFSZ], qbuf[BUFSZ];
    nh_bool ret, firsttime = TRUE;
    struct nh_replay_info rinfo;
    struct nh_cmd_arg noarg;
    struct nh_cmd_desc *cmd;
    
    create_game_windows();
    reset_old_status();
    if (!nh_view_replay_start(fd, &curses_replay_windowprocs, &rinfo))
	return;
    load_keymap();
    
    while (1) {
	draw_msgwin();
	curses_update_status(NULL);
	draw_sidebar();
	draw_replay_info(&rinfo);
	if (firsttime)
	    show_replay_help();
	firsttime = FALSE;
	update_old_status();

	key = get_map_key(TRUE);
	switch (key) {
	    /* step forward */
	    case KEY_RIGHT:
	    case ' ':
		ret = nh_view_replay_step(&rinfo, REPLAY_FORWARD, 1);
		draw_replay_info(&rinfo);
		if (ret == FALSE) {
		    key = curses_msgwin("You have reached the end of this game. "
		                        "Go back or press ESC to exit.");
		    if (key == KEY_ESC)
			goto out;
		}
		break;
		
	    /* step backward */
	    case KEY_LEFT:
		nh_view_replay_step(&rinfo, REPLAY_BACKWARD, 1);
		draw_replay_info(&rinfo);
		break;
		
	    case KEY_ESC:
		goto out;

	    case 'g':
		strncpy(qbuf, "What move do you want to jump to?", BUFSZ);
		if (rinfo.max_moves > 0)
		    sprintf(qbuf + strlen(qbuf), " (Max: %d)", rinfo.max_moves);
		
		curses_getline(qbuf, buf);
		if (buf[0] == '\033' || !(move = atoi(buf)))
		    break;
		nh_view_replay_step(&rinfo, REPLAY_GOTO, move);
		break;

	    case KEY_F(12): /* timetest! */
		if (allow_timetest())
		    timetest(fd, &rinfo);
		break;
		
	    default:
		count = 0;
		noarg.argtype = CMD_ARG_NONE;
		cmd = keymap[key];
		if (!cmd)
		    break;
		if (cmd->flags & CMD_UI)
		    handle_internal_cmd(&cmd, &noarg, &count);
		if (cmd)
		    nh_command(cmd->name, count, &noarg);
		break;
	}
    }
    
out:
    nh_view_replay_finish();
    free_keymap();
    destroy_game_windows();
    cleanup_messages();
}